

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O1

int menu_bar_sub_win_top_proc(Am_Object *self)

{
  Am_Widget_Look AVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  int iVar5;
  Am_Widget_Look look;
  Am_Object menu_bar;
  Am_Object for_item;
  int y;
  int x;
  Am_Widget_Look local_34;
  Am_Object local_30;
  Am_Object local_28;
  int local_20 [2];
  
  pAVar4 = Am_Object::Get(self,0x1d3,0);
  Am_Object::Am_Object(&local_28,pAVar4);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_28,10);
  pAVar4 = Am_Object::Get(&local_30,0x17f,0);
  local_34.value = Am_MOTIF_LOOK_val;
  if ((pAVar4->type != 1) && (pAVar4->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&local_34,pAVar4);
  }
  local_34.value = *(Am_Widget_Look_vals *)&pAVar4->value;
  pAVar4 = Am_Object::Get(&local_30,0x67,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  AVar1.value = local_34.value;
  if (local_34.value < (Am_MACINTOSH_LOOK_val|Am_WINDOWS_LOOK_val)) {
    bVar2 = Am_Object::Valid(&local_28);
    iVar5 = 0;
    if (bVar2) {
      bVar2 = Am_Object::Valid(&local_30);
      iVar5 = 0;
      if (bVar2) {
        local_20[1] = 0;
        local_20[0] = 0;
        Am_Translate_Coordinates
                  (&local_30,0,AVar1.value * 2 + -5 + iVar3,&Am_Screen,local_20 + 1,local_20);
        iVar5 = local_20[0];
      }
    }
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&local_28);
    return iVar5;
  }
  Am_Error("Unknown Look parameter");
}

Assistant:

Am_Define_Formula(int, menu_bar_sub_win_top)
{
  Am_Object for_item = self.Get(Am_FOR_ITEM);
  Am_Object menu_bar = for_item.Get_Owner();
  Am_Widget_Look look = menu_bar.Get(Am_WIDGET_LOOK);
  int height = menu_bar.Get(Am_HEIGHT);

  int overlap = 0;
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    overlap = 5;
    break;

  case Am_WINDOWS_LOOK_val:
    overlap = 3;
    break;

  case Am_MACINTOSH_LOOK_val:
    overlap = 1;
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  if (for_item.Valid() && menu_bar.Valid()) {
    int x = 0; //initializations so no compiler warnings for translate_coords
    int y = 0;
    // get the coordinates of the bottom of the menu item w.r.t. the screen
    Am_Translate_Coordinates(menu_bar, 0, height - overlap, Am_Screen, x, y);
    return y;
  } else
    return 0;
}